

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O0

void __thiscall TPZMultiphysicsCompMesh::CleanElementsConnects(TPZMultiphysicsCompMesh *this)

{
  TPZChunkVector<TPZCompEl_*,_10> *this_00;
  TPZCompEl *pTVar1;
  TPZCompEl **ppTVar2;
  TPZChunkVector<TPZConnect,_10> *this_01;
  TPZCompMesh *in_RDI;
  int64_t el_1;
  TPZCompEl *cel;
  int64_t el;
  int64_t nel;
  int in_stack_0000005c;
  TPZAdmChunkVector<TPZCompEl_*,_10> *in_stack_00000060;
  TPZCompEl *in_stack_ffffffffffffffc8;
  long local_28;
  long nelem;
  
  this_00 = (TPZChunkVector<TPZCompEl_*,_10> *)TPZCompMesh::NElements((TPZCompMesh *)0x1ab2a88);
  for (nelem = 0; nelem < (long)this_00; nelem = nelem + 1) {
    pTVar1 = TPZCompMesh::Element(in_RDI,(int64_t)in_stack_ffffffffffffffc8);
    if (pTVar1 != (TPZCompEl *)0x0) {
      in_stack_ffffffffffffffc8 = pTVar1;
      if (pTVar1 != (TPZCompEl *)0x0) {
        (**(code **)(*(long *)pTVar1 + 8))();
        in_stack_ffffffffffffffc8 = pTVar1;
      }
      ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[](this_00,nelem);
      *ppTVar2 = (TPZCompEl *)0x0;
    }
  }
  TPZAdmChunkVector<TPZCompEl_*,_10>::Resize(in_stack_00000060,in_stack_0000005c);
  this_01 = (TPZChunkVector<TPZConnect,_10> *)
            TPZChunkVector<TPZConnect,_10>::NElements
                      (&(in_RDI->fConnectVec).super_TPZChunkVector<TPZConnect,_10>);
  for (local_28 = 0; local_28 < (long)this_01; local_28 = local_28 + 1) {
    TPZChunkVector<TPZConnect,_10>::operator[](this_01,nelem);
    TPZConnect::RemoveDepend((TPZConnect *)in_RDI);
  }
  TPZAdmChunkVector<TPZConnect,_10>::Resize
            ((TPZAdmChunkVector<TPZConnect,_10> *)in_stack_00000060,in_stack_0000005c);
  return;
}

Assistant:

void TPZMultiphysicsCompMesh::CleanElementsConnects()
{
    int64_t nel = NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = Element(el);
        if(cel)
        {
            delete cel;
            fElementVec[el] = 0;
        }
    }
    fElementVec.Resize(0);
    nel = fConnectVec.NElements();
    for (int64_t el=0; el<nel; el++) {
        fConnectVec[el].RemoveDepend();
    }
    fConnectVec.Resize(0);
}